

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyRead.c
# Opt level: O0

Abc_TtStore_t * setTtStore(char *pFileInput)

{
  Abc_TtStore_t *p_00;
  Abc_TtStore_t *p;
  int nTruths;
  int nVars;
  char *pFileInput_local;
  
  _nTruths = pFileInput;
  Abc_TruthGetParams(pFileInput,(int *)((long)&p + 4),(int *)&p);
  p_00 = Abc_TruthStoreAlloc(p._4_4_,(int)p);
  Abc_TruthStoreRead(_nTruths,p_00);
  return p_00;
}

Assistant:

Abc_TtStore_t * setTtStore(char * pFileInput)
{
    int nVars, nTruths;
    Abc_TtStore_t * p;
    // figure out how many truth table and how many variables
    Abc_TruthGetParams( pFileInput, &nVars, &nTruths );
    // allocate data-structure
    p = Abc_TruthStoreAlloc( nVars, nTruths );

    Abc_TruthStoreRead( pFileInput, p );
    return p;
}